

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  char *__s1;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  string local_1e0;
  string compilerIdVar;
  ostringstream w;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,"CMAKE_",
                 lang);
  std::operator+(&compilerIdVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                 "_COMPILER_ID");
  std::__cxx11::string::~string((string *)&w);
  __s1 = cmMakefile::GetDefinition(mf,&compilerIdVar);
  if (__s1 == (char *)0x0) goto LAB_001bf9c8;
  iVar2 = strcmp(__s1,"AppleClang");
  if (iVar2 == 0) {
    PVar3 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    if (PVar3 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x19,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
    }
    else {
      if (PVar3 != OLD) {
        if (PVar3 != WARN) goto LAB_001bf6dc;
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"CMAKE_POLICY_WARNING_CMP0025",(allocator<char> *)&local_1e0);
          bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x19,id_02);
            poVar4 = std::operator<<((ostream *)&w,(string *)&local_1e0);
            poVar4 = std::operator<<(poVar4,"\nConverting ");
            poVar4 = std::operator<<(poVar4,(string *)lang);
            std::operator<<(poVar4," compiler id \"AppleClang\" to \"Clang\" for compatibility.");
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_1e0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      cmMakefile::AddDefinition(mf,&compilerIdVar,"Clang");
    }
  }
LAB_001bf6dc:
  iVar2 = strcmp(__s1,"QCC");
  if (iVar2 == 0) {
    PVar3 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    if (PVar3 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x2f,id);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
    }
    else {
      if (PVar3 != OLD) {
        if (PVar3 != WARN) goto LAB_001bf9b5;
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"CMAKE_POLICY_WARNING_CMP0047",(allocator<char> *)&local_1e0);
          bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x2f,id_00);
            poVar4 = std::operator<<((ostream *)&w,(string *)&local_1e0);
            poVar4 = std::operator<<(poVar4,"\nConverting ");
            poVar4 = std::operator<<(poVar4,(string *)lang);
            std::operator<<(poVar4," compiler id \"QCC\" to \"GNU\" for compatibility.");
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_1e0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      cmMakefile::AddDefinition(mf,&compilerIdVar,"GNU");
      bVar1 = std::operator==(lang,"C");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_COMPILER_IS_GNUCC",(allocator<char> *)&local_1e0);
        cmMakefile::AddDefinition(mf,(string *)&w,"1");
      }
      else {
        bVar1 = std::operator==(lang,"CXX");
        if (!bVar1) goto LAB_001bf9b5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_COMPILER_IS_GNUCXX",(allocator<char> *)&local_1e0);
        cmMakefile::AddDefinition(mf,(string *)&w,"1");
      }
    }
    std::__cxx11::string::~string((string *)&w);
  }
LAB_001bf9b5:
  iVar2 = strcmp(__s1,"XLClang");
  if (iVar2 == 0) {
    PVar3 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    if (PVar3 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x59,id_03);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
    }
    else {
      if (PVar3 != OLD) {
        if (PVar3 != WARN) goto LAB_001bf9c8;
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"CMAKE_POLICY_WARNING_CMP0089",(allocator<char> *)&local_1e0);
          bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x59,id_04);
            poVar4 = std::operator<<((ostream *)&w,(string *)&local_1e0);
            poVar4 = std::operator<<(poVar4,"\nConverting ");
            poVar4 = std::operator<<(poVar4,(string *)lang);
            std::operator<<(poVar4," compiler id \"XLClang\" to \"XL\" for compatibility.");
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_1e0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      cmMakefile::AddDefinition(mf,&compilerIdVar,"XL");
    }
  }
LAB_001bf9c8:
  std::__cxx11::string::~string((string *)&compilerIdVar);
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = "CMAKE_" + lang + "_COMPILER_ID";
  const char* compilerId = mf->GetDefinition(compilerIdVar);
  if (!compilerId) {
    return;
  }

  if (strcmp(compilerId, "AppleClang") == 0) {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            " compiler id \"AppleClang\" to \"Clang\" for compatibility."
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (strcmp(compilerId, "QCC") == 0) {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            " compiler id \"QCC\" to \"GNU\" for compatibility."
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (strcmp(compilerId, "XLClang") == 0) {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            " compiler id \"XLClang\" to \"XL\" for compatibility."
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }
}